

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

FILE * wrapped_freopen(char *path,char *mode,FILE *stream)

{
  int fd;
  long lVar1;
  FILE *file;
  curious_metadata_record_t io_args;
  freopen_f orig_freopen;
  FILE *stream_local;
  char *mode_local;
  char *path_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  io_args._24_8_ = gotcha_get_wrappee(io_fns[0x19].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    file = (FILE *)0x0;
    io_args.call_count = 0;
    io_args._4_4_ = 0;
    io_args.filesystem = (char *)0x0;
    io_args.mount_point = (char *)0x19;
    curious_get_filesystem(path,(char **)&io_args,&io_args.filesystem);
    curious_call_callbacks(4,&file);
    path_local = (char *)(*(code *)io_args._24_8_)(path,mode,stream);
    if ((FILE *)path_local != (FILE *)0x0) {
      fd = fileno((FILE *)path_local);
      curious_register_file_by_fd(fd);
    }
    curious_call_callbacks(5,&file);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    path_local = (char *)(*(code *)io_args._24_8_)(path,mode,stream);
  }
  return (FILE *)path_local;
}

Assistant:

FILE* wrapped_freopen(const char* path, const char* mode, FILE* stream)
{
    WRAPPER_ENTER(freopen);

    // Get the handle for the original function
    freopen_f orig_freopen = (freopen_f) gotcha_get_wrappee(io_fns[CURIOUS_FREOPEN_ID].handle);

    if (1 == wrapper_call_depth && wrappers_enabled) {
        // NOTE: calling realpath on pathname before passing it to curious_get_filesystem
        //       might be necessary in order to handle relative paths_

        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_FREOPEN_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        FILE* file = orig_freopen(path, mode, stream);

        if (NULL != file) {
            curious_register_file_by_fd(fileno(file));
        }

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);
        WRAPPER_RETURN(file, freopen);
    } else {
        WRAPPER_RETURN(orig_freopen(path, mode, stream), freopen);
    }
}